

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall Lib::Array<char>::~Array(Array<char> *this)

{
  char *pcVar1;
  ulong uVar2;
  
  this->_vptr_Array = (_func_int **)&PTR_fillInterval_00b6a2e8;
  pcVar1 = this->_array;
  if (pcVar1 != (char *)0x0) {
    uVar2 = this->_capacity + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *(undefined8 *)pcVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pcVar1;
      return;
    }
    if (uVar2 < 0x11) {
      *(undefined8 *)pcVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pcVar1;
      return;
    }
    if (uVar2 < 0x19) {
      *(undefined8 *)pcVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pcVar1;
      return;
    }
    if (uVar2 < 0x21) {
      *(undefined8 *)pcVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pcVar1;
      return;
    }
    if (uVar2 < 0x31) {
      *(undefined8 *)pcVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pcVar1;
      return;
    }
    if (0x40 < uVar2) {
      operator_delete(pcVar1,0x10);
      return;
    }
    *(undefined8 *)pcVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pcVar1;
  }
  return;
}

Assistant:

virtual ~Array()
  {
    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,_capacity*sizeof(C),"Array<>");
    }
  }